

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O1

int fits_parser_allocateCol(ParseData *lParse,int nCol,int *status)

{
  char **ppcVar1;
  int iVar2;
  iteratorCol *piVar3;
  DataInfo *pDVar4;
  size_t old_num;
  
  old_num = (size_t)nCol;
  if (nCol * -0x3d70a3d7 + 0x51eb851U < 0xa3d70a3) {
    piVar3 = (iteratorCol *)fits_recalloc(lParse->colData,old_num,(long)(nCol + 0x19),0x110);
    lParse->colData = piVar3;
    pDVar4 = (DataInfo *)fits_recalloc(lParse->varData,old_num,(long)(nCol + 0x19),0xa0);
    lParse->varData = pDVar4;
    memset(lParse->colData + old_num,0,0x1a90);
    memset(lParse->varData + old_num,0,4000);
    piVar3 = lParse->colData;
    if (piVar3 != (iteratorCol *)0x0) {
      if (lParse->varData != (DataInfo *)0x0) goto LAB_0011d210;
      if (piVar3 != (iteratorCol *)0x0) {
        free(piVar3);
      }
    }
    if (lParse->varData != (DataInfo *)0x0) {
      free(lParse->varData);
    }
    lParse->colData = (iteratorCol *)0x0;
    lParse->varData = (DataInfo *)0x0;
    *status = 0x71;
    iVar2 = 0x71;
  }
  else {
LAB_0011d210:
    ppcVar1 = &lParse->varData[old_num].undef;
    *ppcVar1 = (char *)0x0;
    ppcVar1[1] = (char *)0x0;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int fits_parser_allocateCol( ParseData *lParse, int nCol, int *status )
{
   if( (nCol%25)==0 ) {
     lParse->colData = (iteratorCol*) fits_recalloc( lParse->colData,
						     nCol, nCol+25,
						     sizeof(iteratorCol) );
     lParse->varData = (DataInfo   *) fits_recalloc( lParse->varData,
						     nCol, nCol+25,
						     sizeof(DataInfo) );

     memset( (lParse->colData + nCol), 0x00, sizeof(iteratorCol)*25 );
     memset( (lParse->varData + nCol), 0x00, sizeof(DataInfo)*25    );

     if(    lParse->colData  == NULL
	    || lParse->varData  == NULL    ) {
         if( lParse->colData  ) free(lParse->colData);
         if( lParse->varData  ) free(lParse->varData);
         lParse->colData = NULL;
         lParse->varData = NULL;
         return( *status = MEMORY_ALLOCATION );
     }
   }
   lParse->varData[nCol].data  = NULL;
   lParse->varData[nCol].undef = NULL;
   return 0;
}